

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDHPublicKey.cpp
# Opt level: O3

void __thiscall OSSLDHPublicKey::~OSSLDHPublicKey(OSSLDHPublicKey *this)

{
  *(undefined ***)&this->super_DHPublicKey = &PTR_serialise_0019c388;
  DH_free((DH *)this->dh);
  *(undefined ***)&this->super_DHPublicKey = &PTR_serialise_0019b478;
  (this->super_DHPublicKey).y._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&(this->super_DHPublicKey).y.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  (this->super_DHPublicKey).g._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&(this->super_DHPublicKey).g.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  (this->super_DHPublicKey).p._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&(this->super_DHPublicKey).p.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  return;
}

Assistant:

OSSLDHPublicKey::~OSSLDHPublicKey()
{
	DH_free(dh);
}